

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

void gflags::anon_unknown_2::CategorizeAllMatchingFlags
               (set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                *all_matches,string *search_token,string *module,string *package_dir,
               NotableFlags *notable_flags)

{
  CommandLineFlagInfo *pCVar1;
  const_iterator this;
  bool bVar2;
  __type_conflict1 _Var3;
  ulong uVar4;
  reference ppCVar5;
  _Base_ptr p_Var6;
  long local_50;
  size_type slash;
  size_type pos;
  _Self local_38;
  const_iterator it;
  NotableFlags *notable_flags_local;
  string *package_dir_local;
  string *module_local;
  string *search_token_local;
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  *all_matches_local;
  
  it._M_node = (_Base_ptr)notable_flags;
  std::
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  ::clear(&notable_flags->perfect_match_flag);
  std::
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  ::clear((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
           *)&it._M_node[1]._M_left);
  std::
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  ::clear((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
           *)(it._M_node + 3));
  std::
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  ::clear((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
           *)&it._M_node[4]._M_left);
  std::
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  ::clear((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
           *)(it._M_node + 6));
  local_38._M_node =
       (_Base_ptr)
       std::
       set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
       ::begin(all_matches);
  do {
    pos = (size_type)
          std::
          set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          ::end(all_matches);
    bVar2 = std::operator!=(&local_38,(_Self *)&pos);
    if (!bVar2) {
      return;
    }
    slash = 0xffffffffffffffff;
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      ppCVar5 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                          (&local_38);
      slash = std::__cxx11::string::find((string *)&(*ppCVar5)->filename,(ulong)package_dir);
    }
    local_50 = -1;
    if (slash != 0xffffffffffffffff) {
      ppCVar5 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                          (&local_38);
      pCVar1 = *ppCVar5;
      std::__cxx11::string::size();
      local_50 = std::__cxx11::string::find((char)pCVar1 + -0x60,0x2f);
    }
    ppCVar5 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                        (&local_38);
    _Var3 = std::operator==(&(*ppCVar5)->name,search_token);
    this = it;
    if (_Var3) {
      ppCVar5 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                          (&local_38);
      std::
      set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
      ::insert((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                *)this._M_node,ppCVar5);
    }
    else {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        ppCVar5 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                            (&local_38);
        _Var3 = std::operator==(&(*ppCVar5)->filename,module);
        if (_Var3) {
          p_Var6 = it._M_node + 1;
          ppCVar5 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                              (&local_38);
          std::
          set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          ::insert((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                    *)&p_Var6->_M_left,ppCVar5);
          goto LAB_00152f25;
        }
      }
      uVar4 = std::__cxx11::string::empty();
      if ((((uVar4 & 1) == 0) && (slash != 0xffffffffffffffff)) && (local_50 == -1)) {
        p_Var6 = it._M_node + 3;
        ppCVar5 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                            (&local_38);
        std::
        set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
        ::insert((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                  *)p_Var6,ppCVar5);
      }
      else {
        uVar4 = std::__cxx11::string::empty();
        if ((((uVar4 & 1) == 0) && (slash != 0xffffffffffffffff)) && (local_50 != -1)) {
          p_Var6 = it._M_node + 6;
          ppCVar5 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                              (&local_38);
          std::
          set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          ::insert((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                    *)p_Var6,ppCVar5);
        }
      }
    }
LAB_00152f25:
    std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator++(&local_38);
  } while( true );
}

Assistant:

static void CategorizeAllMatchingFlags(
    const set<const CommandLineFlagInfo *> &all_matches,
    const string &search_token,
    const string &module,  // empty if we couldn't find any
    const string &package_dir,  // empty if we couldn't find any
    NotableFlags *notable_flags) {
  notable_flags->perfect_match_flag.clear();
  notable_flags->module_flags.clear();
  notable_flags->package_flags.clear();
  notable_flags->most_common_flags.clear();
  notable_flags->subpackage_flags.clear();

  for (set<const CommandLineFlagInfo *>::const_iterator it =
        all_matches.begin();
      it != all_matches.end();
      ++it) {
    DVLOG(2) << "Examining match '" << (*it)->name << "'";
    DVLOG(7) << "  filename: '" << (*it)->filename << "'";
    string::size_type pos = string::npos;
    if (!package_dir.empty())
      pos = (*it)->filename.find(package_dir);
    string::size_type slash = string::npos;
    if (pos != string::npos)  // candidate for package or subpackage match
      slash = (*it)->filename.find(
          PATH_SEPARATOR,
          pos + package_dir.size() + 1);

    if ((*it)->name == search_token) {
      // Exact match on some flag's name
      notable_flags->perfect_match_flag.insert(*it);
      DVLOG(3) << "Result: perfect match";
    } else if (!module.empty() && (*it)->filename == module) {
      // Exact match on module filename
      notable_flags->module_flags.insert(*it);
      DVLOG(3) << "Result: module match";
    } else if (!package_dir.empty() &&
        pos != string::npos && slash == string::npos) {
      // In the package, since there was no slash after the package portion
      notable_flags->package_flags.insert(*it);
      DVLOG(3) << "Result: package match";
    } else if (false) {
      // In the list of the XXX most commonly supplied flags overall
      // TODO(user): Compile this list.
      DVLOG(3) << "Result: most-common match";
    } else if (!package_dir.empty() &&
        pos != string::npos && slash != string::npos) {
      // In a subdirectory of the package
      notable_flags->subpackage_flags.insert(*it);
      DVLOG(3) << "Result: subpackage match";
    }

    DVLOG(3) << "Result: not special match";
  }
}